

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall re2::DFA::FastSearchLoop(DFA *this,SearchParams *params)

{
  byte bVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  int index;
  bool have_first_byte;
  code *local_30;
  
  lVar2 = (long)(int)((*(byte *)(in_RSI + 0x21) & 1) * 2 + (uint)(-1 < *(int *)(in_RSI + 0x30)) * 4
                     | *(byte *)(in_RSI + 0x22) & 1);
  local_30 = (code *)FastSearchLoop::Searches[lVar2 * 2];
  if (((ulong)local_30 & 1) != 0) {
    local_30 = *(code **)(local_30 +
                         *(long *)(in_RDI + FastSearchLoop::Searches[lVar2 * 2 + 1]) + -1);
  }
  bVar1 = (*local_30)((long *)(in_RDI + FastSearchLoop::Searches[lVar2 * 2 + 1]),in_RSI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DFA::FastSearchLoop(SearchParams* params) {
  // Because the methods are private, the Searches array
  // cannot be declared at top level.
  static bool (DFA::*Searches[])(SearchParams*) = {
    &DFA::SearchFFF,
    &DFA::SearchFFT,
    &DFA::SearchFTF,
    &DFA::SearchFTT,
    &DFA::SearchTFF,
    &DFA::SearchTFT,
    &DFA::SearchTTF,
    &DFA::SearchTTT,
  };

  bool have_first_byte = params->first_byte >= 0;
  int index = 4 * have_first_byte +
              2 * params->want_earliest_match +
              1 * params->run_forward;
  return (this->*Searches[index])(params);
}